

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O1

void __thiscall
efsw::DirectorySnapshot::deleteAll(DirectorySnapshot *this,DirectorySnapshotDiff *Diff)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  DirectorySnapshotDiff *this_00;
  _Self __tmp;
  FileInfo fi;
  FileInfo local_78;
  
  FileInfo::FileInfo(&local_78);
  p_Var3 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      FileInfo::operator=(&local_78,(FileInfo *)(p_Var3 + 2));
      bVar2 = FileInfo::isDirectory(&local_78);
      this_00 = Diff;
      if (bVar2) {
        this_00 = (DirectorySnapshotDiff *)&Diff->DirsDeleted;
      }
      std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                (&this_00->FilesDeleted,&local_78);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::clear(&(this->Files)._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DirectorySnapshot::deleteAll( DirectorySnapshotDiff& Diff ) {
	FileInfo fi;

	for ( FileInfoMap::iterator it = Files.begin(); it != Files.end(); it++ ) {
		fi = it->second;

		if ( fi.isDirectory() ) {
			Diff.DirsDeleted.push_back( fi );
		} else {
			Diff.FilesDeleted.push_back( fi );
		}
	}

	Files.clear();
}